

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumValueDescriptorProto::SharedCtor(EnumValueDescriptorProto *this)

{
  this->_cached_size_ = 0;
  (this->name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  this->options_ = (EnumValueOptions *)0x0;
  this->number_ = 0;
  return;
}

Assistant:

void EnumValueDescriptorProto::SharedCtor() {
  _cached_size_ = 0;
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  ::memset(&options_, 0, reinterpret_cast<char*>(&number_) -
    reinterpret_cast<char*>(&options_) + sizeof(number_));
}